

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O1

CURLcode cw_pause_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  bufq *q;
  void *pvVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  uint type_00;
  _Bool _Var4;
  _Bool _Var5;
  CURLcode CVar6;
  undefined8 *puVar7;
  ulong uVar8;
  CURLcode unaff_R13D;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  size_t nwritten;
  size_t local_50;
  char *local_48;
  size_t local_40;
  uint local_34;
  
  pvVar1 = writer->ctx;
  _Var4 = Curl_cwriter_is_content_decoding(data);
  if (((*(long *)((long)pvVar1 + 0x20) == 0) || (_Var5 = Curl_cwriter_is_paused(data), _Var5)) ||
     (unaff_R13D = cw_pause_flush(data,writer), unaff_R13D == CURLE_OK)) {
    local_48 = buf;
    if ((*(long *)((long)pvVar1 + 0x20) != 0) || (_Var5 = Curl_cwriter_is_paused(data), _Var5)) {
      CVar6 = CURLE_OK;
      local_50 = 0;
    }
    else {
      local_34 = type & 0xffffff7f;
      do {
        local_50 = 0x1000;
        if (blen < 0x1000) {
          local_50 = blen;
        }
        if ((_Var4 & (byte)type) == 0) {
          local_50 = blen;
        }
        type_00 = type;
        if (local_50 < blen) {
          type_00 = local_34;
        }
        CVar6 = Curl_cwriter_write(data,writer->next,type_00,local_48,local_50);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"[PAUSE] writing %zu/%zu bytes of type %x -> %d",local_50,blen,
                         (ulong)type_00,(ulong)CVar6);
        }
        if (CVar6 == CURLE_OK) {
          local_48 = local_48 + local_50;
          blen = blen - local_50;
          bVar11 = blen != 0;
          if (!bVar11) {
            unaff_R13D = CURLE_OK;
          }
        }
        else {
          bVar11 = false;
          unaff_R13D = CVar6;
        }
        if (!bVar11) {
          return unaff_R13D;
        }
      } while ((*(long *)((long)pvVar1 + 0x20) == 0) &&
              (_Var5 = Curl_cwriter_is_paused(data), !_Var5));
    }
    uVar10 = (ulong)unaff_R13D;
    uVar9 = (ulong)CVar6;
    do {
      local_40 = 0;
      lVar2 = *(long *)((long)pvVar1 + 0x20);
      if (((lVar2 == 0) || ((type & 1U) == 0)) || (*(int *)(lVar2 + 0x48) != type)) {
        puVar7 = (undefined8 *)(*Curl_ccalloc)(1,0x50);
        uVar8 = 0x1b;
        if (puVar7 != (undefined8 *)0x0) {
          q = (bufq *)(puVar7 + 1);
          *(int *)(puVar7 + 9) = type;
          if ((type & 1U) == 0) {
            Curl_bufq_init(q,blen,1);
          }
          else {
            Curl_bufq_init2(q,0x4000,1,3);
          }
          if (puVar7 != (undefined8 *)0x0) {
            *puVar7 = *(undefined8 *)((long)pvVar1 + 0x20);
            *(undefined8 **)((long)pvVar1 + 0x20) = puVar7;
            CVar6 = Curl_bufq_cwrite(q,local_48,blen,&local_40);
            uVar9 = (ulong)CVar6;
            uVar8 = uVar10;
          }
        }
        if (puVar7 != (undefined8 *)0x0) goto LAB_0012451b;
        bVar11 = false;
        uVar10 = uVar8;
      }
      else {
        CVar6 = Curl_bufq_cwrite((bufq *)(lVar2 + 8),local_48,blen,&local_40);
        uVar9 = (ulong)CVar6;
        uVar8 = uVar10;
LAB_0012451b:
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"[PAUSE] buffer %zu more bytes of type %x, total=%zu -> %d",local_40,
                         (ulong)(uint)type,*(long *)((long)pvVar1 + 0x28) + local_50,uVar9);
        }
        bVar11 = false;
        uVar10 = uVar9;
        if ((int)uVar9 == 0) {
          *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) + local_40;
          local_48 = local_48 + local_40;
          blen = blen - local_40;
          bVar11 = true;
          uVar9 = 0;
          uVar10 = uVar8;
        }
      }
      unaff_R13D = (CURLcode)uVar10;
    } while ((bVar11) && (unaff_R13D = (CURLcode)uVar9, blen != 0));
  }
  return unaff_R13D;
}

Assistant:

static CURLcode cw_pause_write(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               const char *buf, size_t blen)
{
  struct cw_pause_ctx *ctx = writer->ctx;
  CURLcode result = CURLE_OK;
  size_t wlen = 0;
  bool decoding = Curl_cwriter_is_content_decoding(data);

  if(ctx->buf && !Curl_cwriter_is_paused(data)) {
    result = cw_pause_flush(data, writer);
    if(result)
      return result;
  }

  while(!ctx->buf && !Curl_cwriter_is_paused(data)) {
    int wtype = type;
    DEBUGASSERT(!ctx->buf);
    /* content decoding might blow up size considerably, write smaller
     * chunks to make pausing need buffer less. */
    wlen = (decoding && (type & CLIENTWRITE_BODY)) ?
           CURLMIN(blen, CW_PAUSE_DEC_WRITE_CHUNK) : blen;
    if(wlen < blen)
      wtype &= ~CLIENTWRITE_EOS;
    result = Curl_cwriter_write(data, writer->next, wtype, buf, wlen);
    CURL_TRC_WRITE(data, "[PAUSE] writing %zu/%zu bytes of type %x -> %d",
                   wlen, blen, wtype, result);
    if(result)
      return result;
    buf += wlen;
    blen -= wlen;
    if(!blen)
      return result;
  }

  do {
    size_t nwritten = 0;
    if(ctx->buf && (ctx->buf->type == type) && (type & CLIENTWRITE_BODY)) {
      /* same type and body, append to current buffer which has a soft
       * limit and should take everything up to OOM. */
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    else {
      /* Need a new buf, type changed */
      struct cw_pause_buf *cwbuf = cw_pause_buf_create(type, blen);
      if(!cwbuf)
        return CURLE_OUT_OF_MEMORY;
      cwbuf->next = ctx->buf;
      ctx->buf = cwbuf;
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    CURL_TRC_WRITE(data, "[PAUSE] buffer %zu more bytes of type %x, "
                   "total=%zu -> %d", nwritten, type, ctx->buf_total + wlen,
                   result);
    if(result)
      return result;
    buf += nwritten;
    blen -= nwritten;
    ctx->buf_total += nwritten;
  } while(blen);

  return result;
}